

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wordset.cpp
# Opt level: O0

void __thiscall wordset::create_inserts(wordset *this,string *word)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  reference pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  undefined8 local_68;
  string local_60 [8];
  string temp;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char c;
  iterator __end2;
  iterator __begin2;
  string *__range2;
  int i;
  string *word_local;
  wordset *this_local;
  
  __range2._4_4_ = 0;
  while( true ) {
    uVar3 = std::__cxx11::string::length();
    if (uVar3 <= (ulong)(long)__range2._4_4_) break;
    __end2._M_current = (char *)std::__cxx11::string::begin();
    _Stack_38._M_current = (char *)std::__cxx11::string::end();
    while( true ) {
      bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8);
      if (!bVar2) break;
      pcVar4 = __gnu_cxx::
               __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&__end2);
      cVar1 = *pcVar4;
      std::__cxx11::string::string(local_60,(string *)word);
      local_78._M_current = (char *)std::__cxx11::string::begin();
      local_70 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_78,(long)__range2._4_4_);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_68,&local_70);
      std::__cxx11::string::insert(local_60,local_68,(int)cVar1);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->edits,(value_type *)local_60);
      std::__cxx11::string::~string(local_60);
      __gnu_cxx::
      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&__end2);
    }
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  return;
}

Assistant:

void wordset::create_inserts(const string &word) {
    for (int i = 0; i < word.length(); ++i) {
        for (char c : alphabet) {
            string temp = word;
            temp.insert(temp.begin()+i, c);
            edits.insert(temp);
        }
    }
}